

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve.cpp
# Opt level: O0

double __thiscall Curve::getXofY(Curve *this,double y)

{
  double dVar1;
  double dVar2;
  double dVar3;
  reference pvVar4;
  double dVar5;
  size_type sVar6;
  double dy;
  size_type i;
  double y_local;
  Curve *this_local;
  
  pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,0);
  if (*pvVar4 < y) {
    for (dy = 4.94065645841247e-324;
        dVar5 = (double)std::vector<double,_std::allocator<double>_>::size(&this->yData),
        (ulong)dy < (ulong)dVar5; dy = (double)((long)dy + 1)) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(size_type)dy);
      if (y <= *pvVar4) {
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->yData,(size_type)dy);
        dVar5 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(long)dy - 1)
        ;
        dVar5 = dVar5 - *pvVar4;
        if ((dVar5 == 0.0) && (!NAN(dVar5))) {
          pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&this->xData,(long)dy - 1);
          return *pvVar4;
        }
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)dy - 1)
        ;
        dVar1 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->yData,(long)dy - 1)
        ;
        dVar2 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&this->xData,(size_type)dy);
        dVar3 = *pvVar4;
        pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,(long)dy - 1)
        ;
        return ((y - dVar2) / dVar5) * (dVar3 - *pvVar4) + dVar1;
      }
    }
    sVar6 = std::vector<double,_std::allocator<double>_>::size(&this->yData);
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,sVar6 - 1);
    this_local = (Curve *)*pvVar4;
  }
  else {
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](&this->xData,0);
    this_local = (Curve *)*pvVar4;
  }
  return (double)this_local;
}

Assistant:

double Curve::getXofY(double y)
// Assumes Y is increasing with X
{
    if ( y <= yData[0] ) return xData[0];

    for (vector<double>::size_type i = 1; i < yData.size(); i++)
    {
    	if ( y <= yData[i] )
    	{
            double dy = yData[i] - yData[i-1];
            if ( dy == 0.0 ) return xData[i-1];
            return xData[i-1] + (y - yData[i-1]) / dy * (xData[i] - xData[i-1]);
        }
    }
    return xData[yData.size()-1];
}